

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unparser.cc
# Opt level: O1

Status __thiscall
google::protobuf::json_internal::anon_unknown_4::
WriteMessage<google::protobuf::json_internal::UnparseProto2Descriptor>
          (anon_unknown_4 *this,JsonWriter *writer,
          Msg<google::protobuf::json_internal::UnparseProto2Descriptor> *msg,
          Desc<google::protobuf::json_internal::UnparseProto2Descriptor> *desc,bool is_top_level)

{
  byte bVar1;
  int iVar2;
  Msg<google::protobuf::json_internal::UnparseProto2Descriptor> *this_00;
  anon_unknown_4 *paVar3;
  bool bVar4;
  bool bVar5;
  MessageType MVar6;
  Field f;
  size_t sVar7;
  long lVar8;
  ulong uVar9;
  Field pFVar10;
  undefined1 *puVar11;
  string *psVar12;
  Descriptor *type;
  MessageLite *pMVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  size_t sVar17;
  char *extraout_RDX;
  uint uVar18;
  anon_union_8_1_1246618d_for_StatusOrData<int>_1 aVar19;
  int iVar20;
  char *pcVar21;
  undefined8 uVar22;
  uint uVar23;
  anon_union_8_2_a3c22f61_for_StatusOrData<long>_3 aVar24;
  anon_union_8_2_a3c22f61_for_StatusOrData<long>_3 *this_01;
  int iVar25;
  anon_union_8_1_1246618d_for_StatusOrData<int>_1 aVar26;
  string_view name;
  string_view name_00;
  string_view data;
  string_view name_01;
  anon_class_16_2_3789d670 body;
  anon_class_16_2_3789d670 body_00;
  Metadata MVar27;
  bool first;
  StatusOr<int> nanos;
  StatusOr<std::basic_string_view<char,_std::char_traits<char>_>_> type_url;
  DynamicMessageFactory factory;
  anon_union_8_2_a3c22f61_for_StatusOrData<long>_3 local_180;
  anon_union_8_1_1246618d_for_StatusOrData<int>_1 aStack_178;
  anon_union_8_1_1246618d_for_StatusOrData<int>_1 local_170;
  anon_union_8_2_a3c22f61_for_StatusOrData<long>_3 local_150;
  anon_union_8_1_1246618d_for_StatusOrData<int>_1 local_148;
  anon_union_8_1_1246618d_for_StatusOrData<int>_1 local_140;
  anon_union_8_1_1246618d_for_StatusOrData<int>_1 local_130;
  uint local_128;
  undefined4 uStack_124;
  anon_union_8_2_a3c22f61_for_StatusOrData<long>_3 local_120;
  size_t local_110;
  anon_union_8_2_a3c22f61_for_StatusOrData<long>_3 local_108;
  char *local_100;
  pointer pcStack_f8;
  Field local_f0;
  Field local_e8;
  anon_union_8_2_a3c22f61_for_StatusOrData<long>_3 local_e0;
  anon_union_8_2_a3c22f61_for_StatusOrData<long>_3 local_d8;
  anon_union_8_1_1246618d_for_StatusOrData<int>_1 aStack_d0;
  code *local_c8;
  ulong local_c0;
  code *local_b8;
  ulong local_b0;
  code *local_a8;
  ulong local_a0;
  code *local_98;
  ulong local_90;
  code *local_88;
  long local_80;
  code *local_78;
  ulong local_70;
  code *local_68;
  Msg<google::protobuf::json_internal::UnparseProto2Descriptor> *local_60;
  anon_unknown_4 *local_58;
  string *local_50;
  undefined1 *local_48;
  Quoted<std::basic_string_view<char,_std::char_traits<char>_>_> local_40;
  
  name._M_str = (char *)msg;
  name._M_len = (size_t)desc->all_names_[1]._M_dataplus._M_p;
  MVar6 = ClassifyMessage((json_internal *)desc->all_names_[1]._M_string_length,name);
  local_60 = msg;
  switch(MVar6) {
  case kAny:
    pFVar10 = Proto2Descriptor::MustHaveField(desc,1);
    f = Proto2Descriptor::MustHaveField(desc,2);
    sVar17 = UnparseProto2Descriptor::GetSize(pFVar10,msg);
    local_e8 = f;
    sVar7 = UnparseProto2Descriptor::GetSize(f,msg);
    if (sVar7 != 0 || sVar17 != 0) {
      if (sVar17 == 0) {
        pcVar21 = "broken Any: missing type URL";
        uVar22 = 0x1c;
LAB_002d3340:
        absl::lts_20240722::InvalidArgumentError(this,uVar22,pcVar21);
        return (Status)(uintptr_t)this;
      }
      if ((sVar7 == 0) && ((writer->options_).allow_legacy_syntax == false)) {
        pcVar21 = "broken Any: missing value";
        uVar22 = 0x19;
        goto LAB_002d3340;
      }
      local_110 = sVar7;
      io::zc_sink_internal::ZeroCopyStreamByteSink::Append(&writer->sink_,"{",1);
      writer->indent_ = writer->indent_ + 1;
      MVar27 = Message::GetMetadata(msg);
      local_f0 = (Field)&writer->scratch_buf_;
      psVar12 = Reflection::GetStringReference(MVar27.reflection,msg,pFVar10,&writer->scratch_buf_);
      pcStack_f8 = (psVar12->_M_dataplus)._M_p;
      local_100 = (char *)psVar12->_M_string_length;
      local_108.data_ = 1;
      *(undefined8 *)this = 1;
      JsonWriter::NewLine(writer);
      io::zc_sink_internal::ZeroCopyStreamByteSink::Append(&writer->sink_,"\"@type\":",8);
      if ((writer->options_).add_whitespace == true) {
        io::zc_sink_internal::ZeroCopyStreamByteSink::Append(&writer->sink_," ",1);
      }
      if (local_108.data_ == 1) {
        local_40.value.
        super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>_>.
        super__Head_base<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_false>.
        _M_head_impl._M_len = (size_t)local_100;
        local_40.value.
        super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>_>.
        super__Head_base<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_false>.
        _M_head_impl._M_str = pcStack_f8;
        JsonWriter::Write<std::basic_string_view<char,std::char_traits<char>>>(writer,&local_40);
        if (local_108.data_ == 1) {
          local_130 = (anon_union_8_1_1246618d_for_StatusOrData<int>_1)&local_120;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_130,pcStack_f8,pcStack_f8 + (long)local_100);
          this_00 = local_60;
          lVar8 = std::__cxx11::string::rfind((char)&local_130,0x2f);
          uVar9 = lVar8 + 1;
          if (uVar9 < 2) {
            local_e0.data_ = 0x3c;
            local_d8 = (anon_union_8_2_a3c22f61_for_StatusOrData<long>_3)0x3eae64;
            local_180.data_._4_4_ = uStack_124;
            local_180.data_._0_4_ = local_128;
            aStack_178 = local_130;
            absl::lts_20240722::StrCat_abi_cxx11_((AlphaNum *)&local_150,(AlphaNum *)&local_e0);
            absl::lts_20240722::InvalidArgumentError(this,local_148,local_150.data_);
            if ((anon_union_8_1_1246618d_for_StatusOrData<int>_1 *)local_150.data_ != &local_140) {
LAB_002d3434:
              operator_delete((void *)local_150,(long)local_140 + 1);
            }
          }
          else {
            name_00._M_len = CONCAT44(uStack_124,local_128) - uVar9;
            if (CONCAT44(uStack_124,local_128) < uVar9) {
              std::__throw_out_of_range_fmt
                        ("%s: __pos (which is %zu) > __size (which is %zu)",
                         "basic_string_view::substr",uVar9);
            }
            name_00._M_str = (char *)(uVar9 + (long)local_130);
            type = DescriptorPool::FindMessageTypeByName(desc->file_->pool_,name_00);
            if (type == (Descriptor *)0x0) {
              aStack_178 = (anon_union_8_1_1246618d_for_StatusOrData<int>_1)
                           absl::lts_20240722::str_format_internal::FormatArgImpl::
                           Dispatch<std::__cxx11::string>;
              local_180.data_ = (long)&local_130;
              absl::lts_20240722::str_format_internal::FormatPack_abi_cxx11_
                        (&local_e0,"could not find @type \'%s\'",0x19,&local_180,1);
              absl::lts_20240722::InvalidArgumentError(this,local_d8.data_,local_e0.data_);
              local_140 = aStack_d0;
              local_150 = local_e0;
              if ((anon_union_8_1_1246618d_for_StatusOrData<int>_1 *)local_e0.data_ != &aStack_d0)
              goto LAB_002d3434;
            }
            else {
              if (local_110 == 0) {
                aVar19 = (anon_union_8_1_1246618d_for_StatusOrData<int>_1)0x0;
                aVar24.data_ = 0;
              }
              else {
                MVar27 = Message::GetMetadata(this_00);
                psVar12 = Reflection::GetStringReference
                                    (MVar27.reflection,this_00,local_e8,(string *)local_f0);
                aVar19 = (anon_union_8_1_1246618d_for_StatusOrData<int>_1)
                         (psVar12->_M_dataplus)._M_p;
                aVar24 = (anon_union_8_2_a3c22f61_for_StatusOrData<long>_3)psVar12->_M_string_length
                ;
                local_e0.data_ = 1;
                *(undefined8 *)this = 1;
                local_d8 = aVar24;
                aStack_d0 = aVar19;
                absl::lts_20240722::internal_statusor::
                StatusOrData<std::basic_string_view<char,_std::char_traits<char>_>_>::~StatusOrData
                          ((StatusOrData<std::basic_string_view<char,_std::char_traits<char>_>_> *)
                           &local_e0);
              }
              DynamicMessageFactory::DynamicMessageFactory((DynamicMessageFactory *)&local_e0);
              pMVar13 = &DynamicMessageFactory::GetPrototype
                                   ((DynamicMessageFactory *)&local_e0,type)->super_MessageLite;
              pMVar13 = MessageLite::New(pMVar13,(Arena *)0x0);
              data._M_str = (char *)aVar19;
              data._M_len = aVar24.data_;
              MessageLite::ParsePartialFromString(pMVar13,data);
              local_180.data_ = local_180.data_ & 0xffffffffffffff00;
              name_01._M_str = extraout_RDX;
              name_01._M_len = (size_t)type->all_names_[1]._M_dataplus._M_p;
              MVar6 = ClassifyMessage((json_internal *)type->all_names_[1]._M_string_length,name_01)
              ;
              if (MVar6 == kNotWellKnown) {
                WriteFields<google::protobuf::json_internal::UnparseProto2Descriptor>
                          (this,writer,
                           (Msg<google::protobuf::json_internal::UnparseProto2Descriptor> *)pMVar13,
                           type,(bool *)&local_180);
              }
              else {
                io::zc_sink_internal::ZeroCopyStreamByteSink::Append(&writer->sink_,",",1);
                JsonWriter::NewLine(writer);
                io::zc_sink_internal::ZeroCopyStreamByteSink::Append(&writer->sink_,"\"value\":",8);
                if ((writer->options_).add_whitespace == true) {
                  io::zc_sink_internal::ZeroCopyStreamByteSink::Append(&writer->sink_," ",1);
                }
                WriteMessage<google::protobuf::json_internal::UnparseProto2Descriptor>
                          (this,writer,
                           (Msg<google::protobuf::json_internal::UnparseProto2Descriptor> *)pMVar13,
                           type,false);
              }
              if (*(long *)this == 1) {
                writer->indent_ = writer->indent_ + -1;
                if (local_180.data_._0_1_ == '\0') {
                  JsonWriter::NewLine(writer);
                }
                io::zc_sink_internal::ZeroCopyStreamByteSink::Append(&writer->sink_,"}",1);
                *(undefined8 *)this = 1;
              }
              (*pMVar13->_vptr_MessageLite[1])(pMVar13);
              DynamicMessageFactory::~DynamicMessageFactory((DynamicMessageFactory *)&local_e0);
            }
          }
          if (local_130 != (anon_union_8_1_1246618d_for_StatusOrData<int>_1)&local_120) {
            operator_delete((void *)local_130,local_120.data_ + 1);
          }
          this_01 = &local_108;
          goto LAB_002d362f;
        }
      }
      else {
        absl::lts_20240722::internal_statusor::Helper::Crash((Status *)&local_108);
      }
      absl::lts_20240722::internal_statusor::Helper::Crash((Status *)&local_108);
LAB_002d378d:
      absl::lts_20240722::internal_statusor::Helper::Crash((Status *)&local_150);
LAB_002d3797:
      absl::lts_20240722::internal_statusor::Helper::Crash((Status *)&local_150);
LAB_002d37a1:
      absl::lts_20240722::internal_statusor::Helper::Crash((Status *)&local_e0);
LAB_002d37ae:
      absl::lts_20240722::internal_statusor::Helper::Crash((Status *)&local_e0);
LAB_002d37bb:
      pcVar21 = 
      "google.protobuf.Value cannot encode double values for nan, because it would be parsed as a string"
      ;
      uVar22 = 0x61;
LAB_002d2c78:
      absl::lts_20240722::InvalidArgumentError(this,uVar22,pcVar21);
LAB_002d2f8b:
      absl::lts_20240722::internal_statusor::StatusOrData<double>::~StatusOrData
                ((StatusOrData<double> *)&local_e0);
      return (Status)(uintptr_t)this;
    }
    pcVar21 = "{}";
    sVar17 = 2;
    goto LAB_002d2bdd;
  case kWrapper:
    pFVar10 = Proto2Descriptor::MustHaveField(desc,1);
    sVar17 = UnparseProto2Descriptor::GetSize(pFVar10,msg);
    if (sVar17 == 0) {
      WriteSingular<google::protobuf::json_internal::UnparseProto2Descriptor>(this,writer,pFVar10);
    }
    else {
      (anonymous_namespace)::
      WriteSingular<google::protobuf::json_internal::UnparseProto2Descriptor,google::protobuf::Message_const&>
                ((_anonymous_namespace_ *)this,writer,pFVar10,msg);
    }
    break;
  case kStruct:
    pFVar10 = Proto2Descriptor::MustHaveField(desc,1);
    WriteMap<google::protobuf::json_internal::UnparseProto2Descriptor>(this,writer,msg,pFVar10);
    break;
  case kList:
    pFVar10 = Proto2Descriptor::MustHaveField(desc,1);
    WriteRepeated<google::protobuf::json_internal::UnparseProto2Descriptor>(this,writer,msg,pFVar10)
    ;
    break;
  case kValue:
    pFVar10 = Proto2Descriptor::MustHaveField(desc,1);
    sVar17 = UnparseProto2Descriptor::GetSize(pFVar10,msg);
    if (sVar17 != 0) {
      pcVar21 = "null";
      sVar17 = 4;
      goto LAB_002d2bdd;
    }
    pFVar10 = Proto2Descriptor::MustHaveField(desc,2);
    sVar17 = UnparseProto2Descriptor::GetSize(pFVar10,msg);
    if (sVar17 != 0) {
      MVar27 = Message::GetMetadata(msg);
      local_d8 = (anon_union_8_2_a3c22f61_for_StatusOrData<long>_3)
                 Reflection::GetDouble(MVar27.reflection,msg,pFVar10);
      local_e0.data_ = 1;
      *(undefined8 *)this = 1;
      if (NAN((double)local_d8)) goto LAB_002d37bb;
      if ((local_d8.data_ & 0x7fffffffffffffffU) != 0x7ff0000000000000) {
        JsonWriter::Write(writer,(double)local_d8);
        *(undefined8 *)this = 1;
        goto LAB_002d2f8b;
      }
      pcVar21 = 
      "google.protobuf.Value cannot encode double values for infinity, because it would be parsed as a string"
      ;
      uVar22 = 0x66;
      goto LAB_002d2c78;
    }
    pFVar10 = Proto2Descriptor::MustHaveField(desc,3);
    sVar17 = UnparseProto2Descriptor::GetSize(pFVar10,msg);
    if (sVar17 != 0) {
      UnparseProto2Descriptor::GetString
                ((StatusOr<std::basic_string_view<char,_std::char_traits<char>_>_> *)&local_e0,
                 pFVar10,&writer->scratch_buf_,msg);
      *(anon_union_8_2_a3c22f61_for_StatusOrData<long>_3 *)this = local_e0;
      if ((local_e0.data_ & 1U) == 0) {
        LOCK();
        *(int *)local_e0 = *(int *)local_e0 + 1;
        UNLOCK();
      }
      if (*(long *)this == 1) {
        absl::lts_20240722::Status::~Status((Status *)this);
        if ((anon_union_8_1_1246618d_for_StatusOrData<int>_1)local_e0.data_ !=
            (anon_union_8_1_1246618d_for_StatusOrData<int>_1)0x1) goto LAB_002d37a1;
        local_180 = local_d8;
        aStack_178 = aStack_d0;
        JsonWriter::Write<std::basic_string_view<char,std::char_traits<char>>>
                  (writer,(Quoted<std::basic_string_view<char,_std::char_traits<char>_>_> *)
                          &local_180);
        *(undefined8 *)this = 1;
      }
      this_01 = &local_e0;
LAB_002d362f:
      absl::lts_20240722::internal_statusor::
      StatusOrData<std::basic_string_view<char,_std::char_traits<char>_>_>::~StatusOrData
                ((StatusOrData<std::basic_string_view<char,_std::char_traits<char>_>_> *)this_01);
      return (Status)(uintptr_t)this;
    }
    pFVar10 = Proto2Descriptor::MustHaveField(desc,4);
    sVar17 = UnparseProto2Descriptor::GetSize(pFVar10,msg);
    if (sVar17 != 0) {
      MVar27 = Message::GetMetadata(msg);
      bVar5 = Reflection::GetBool(MVar27.reflection,msg,pFVar10);
      local_d8.data_._0_1_ = bVar5;
      local_e0.data_ = 1;
      *(undefined8 *)this = 1;
      absl::lts_20240722::Status::~Status((Status *)this);
      if ((anon_union_8_1_1246618d_for_StatusOrData<int>_1)local_e0.data_ ==
          (anon_union_8_1_1246618d_for_StatusOrData<int>_1)0x1) {
        pcVar21 = "false";
        if ((local_d8.data_ & 0xffU) != 0) {
          pcVar21 = "true";
        }
        io::zc_sink_internal::ZeroCopyStreamByteSink::Append
                  (&writer->sink_,pcVar21,local_d8.data_ & 0xffU ^ 5);
        *(undefined8 *)this = 1;
        absl::lts_20240722::internal_statusor::StatusOrData<bool>::~StatusOrData
                  ((StatusOrData<bool> *)&local_e0);
        return (Status)(uintptr_t)this;
      }
      goto LAB_002d37ae;
    }
    pFVar10 = Proto2Descriptor::MustHaveField(desc,5);
    sVar17 = UnparseProto2Descriptor::GetSize(pFVar10,msg);
    if (sVar17 != 0) {
      MVar27 = Message::GetMetadata(msg);
      local_d8 = (anon_union_8_2_a3c22f61_for_StatusOrData<long>_3)
                 Reflection::GetMessage(MVar27.reflection,msg,pFVar10,(MessageFactory *)0x0);
      local_e0.data_ = 1;
      *(undefined8 *)this = 1;
      absl::lts_20240722::Status::~Status((Status *)this);
      body.x = (StatusOr<const_google::protobuf::Message_*> *)writer;
      body.writer = (JsonWriter *)pFVar10;
      Proto2Descriptor::
      WithFieldType<google::protobuf::json_internal::(anonymous_namespace)::WriteValue<google::protobuf::json_internal::UnparseProto2Descriptor>(google::protobuf::json_internal::JsonWriter&,google::protobuf::json_internal::UnparseProto2Descriptor::Msg_const&,google::protobuf::json_internal::UnparseProto2Descriptor::Desc_const&,bool)::_lambda(google::protobuf::Descriptor_const&)_1_>
                ((Field)this,body);
LAB_002d370d:
      absl::lts_20240722::internal_statusor::StatusOrData<const_google::protobuf::Message_*>::
      ~StatusOrData((StatusOrData<const_google::protobuf::Message_*> *)&local_e0);
      return (Status)(uintptr_t)this;
    }
    pFVar10 = Proto2Descriptor::MustHaveField(desc,6);
    sVar17 = UnparseProto2Descriptor::GetSize(pFVar10,msg);
    if (sVar17 != 0) {
      MVar27 = Message::GetMetadata(msg);
      local_d8 = (anon_union_8_2_a3c22f61_for_StatusOrData<long>_3)
                 Reflection::GetMessage(MVar27.reflection,msg,pFVar10,(MessageFactory *)0x0);
      local_e0.data_ = 1;
      *(undefined8 *)this = 1;
      absl::lts_20240722::Status::~Status((Status *)this);
      body_00.x = (StatusOr<const_google::protobuf::Message_*> *)writer;
      body_00.writer = (JsonWriter *)pFVar10;
      Proto2Descriptor::
      WithFieldType<google::protobuf::json_internal::(anonymous_namespace)::WriteValue<google::protobuf::json_internal::UnparseProto2Descriptor>(google::protobuf::json_internal::JsonWriter&,google::protobuf::json_internal::UnparseProto2Descriptor::Msg_const&,google::protobuf::json_internal::UnparseProto2Descriptor::Desc_const&,bool)::_lambda(google::protobuf::Descriptor_const&)_2_>
                ((Field)this,body_00);
      goto LAB_002d370d;
    }
    if (!is_top_level) {
      absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_e0,
                 "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/src/google/protobuf/json/internal/unparser.cc"
                 ,0x22b,0xc,"is_top_level");
      absl::lts_20240722::log_internal::LogMessage::
      CopyToEncodedBuffer<(absl::lts_20240722::log_internal::LogMessage::StringType)0>
                (&local_e0,0x81,
                 "empty, non-top-level Value must be handled one layer up, since it prints an empty string; reaching this statement is always a bug"
                );
      if (!is_top_level) {
        absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)&local_e0);
      }
    }
    goto LAB_002d2be2;
  default:
    io::zc_sink_internal::ZeroCopyStreamByteSink::Append(&writer->sink_,"{",1);
    writer->indent_ = writer->indent_ + 1;
    local_e0.data_._0_1_ = 1;
    WriteFields<google::protobuf::json_internal::UnparseProto2Descriptor>
              (this,writer,msg,desc,(bool *)&local_e0);
    if (*(long *)this != 1) {
      return (Status)(uintptr_t)this;
    }
    writer->indent_ = writer->indent_ + -1;
    if (local_e0.data_._0_1_ == '\0') {
      JsonWriter::NewLine(writer);
    }
    pcVar21 = "}";
    sVar17 = 1;
    goto LAB_002d2bdd;
  case kTimestamp:
    pFVar10 = Proto2Descriptor::MustHaveField(desc,1);
    sVar17 = UnparseProto2Descriptor::GetSize(pFVar10,msg);
    if (sVar17 == 0) {
      local_148 = (anon_union_8_1_1246618d_for_StatusOrData<int>_1)0x0;
    }
    else {
      MVar27 = Message::GetMetadata(msg);
      local_148 = (anon_union_8_1_1246618d_for_StatusOrData<int>_1)
                  Reflection::GetInt64(MVar27.reflection,msg,pFVar10);
    }
    local_150.data_ = 1;
    *(undefined8 *)this = 1;
    if ((long)local_148 < -0xe7791f700) {
      pcVar21 = "minimum acceptable time value is 0001-01-01T00:00:00Z";
    }
    else {
      if ((long)local_148 < 0x3afff44180) {
        local_148 = (anon_union_8_1_1246618d_for_StatusOrData<int>_1)((long)local_148 + 0xe7791f700)
        ;
        pFVar10 = Proto2Descriptor::MustHaveField(desc,2);
        sVar17 = UnparseProto2Descriptor::GetSize(pFVar10,msg);
        if (sVar17 == 0) {
          local_128 = 0;
        }
        else {
          MVar27 = Message::GetMetadata(msg);
          local_128 = Reflection::GetInt32(MVar27.reflection,msg,pFVar10);
        }
        local_130 = (anon_union_8_1_1246618d_for_StatusOrData<int>_1)0x1;
        *(undefined8 *)this = 1;
        if ((anon_union_8_1_1246618d_for_StatusOrData<int>_1)local_150.data_ !=
            (anon_union_8_1_1246618d_for_StatusOrData<int>_1)0x1) goto LAB_002d378d;
        iVar16 = (int)(SUB168(SEXT816((long)local_148) * SEXT816(0x1845c8a0ce512957),8) >> 0xd);
        iVar20 = SUB164(SEXT816((long)local_148) * SEXT816(0x1845c8a0ce512957),0xc) >> 0x1f;
        iVar2 = ((iVar16 - iVar20) * 4 + 0x6d40ac) / 0x23ab1;
        iVar14 = iVar2 * 0x23ab1;
        iVar15 = iVar14 + 3;
        iVar14 = iVar14 + 6;
        if (-1 < iVar15) {
          iVar14 = iVar15;
        }
        iVar20 = ((iVar16 - iVar20) + 0x1b502b) - (iVar14 >> 2);
        iVar15 = iVar20 * 4000;
        iVar15 = iVar15 + (int)((ulong)((long)(iVar15 + 4000) * -0x48441d23) >> 0x20) + 4000;
        iVar16 = (iVar15 >> 0x14) - (iVar15 >> 0x1f);
        iVar14 = iVar16 * 0x5b5;
        iVar15 = iVar14 + 3;
        if (-1 < iVar14) {
          iVar15 = iVar14;
        }
        iVar14 = (iVar20 - (iVar15 >> 2)) + 0x1f;
        iVar15 = iVar14 * 0x50;
        iVar20 = iVar15 / 0x98f;
        iVar25 = (int)((ulong)((long)(iVar20 * 0x98f) * -0x66666667) >> 0x20);
        local_c0 = (ulong)(uint)((iVar14 - (iVar25 >> 0x1f)) + (iVar25 >> 5));
        iVar15 = iVar15 / 0x6925;
        aStack_d0.status_.rep_._0_4_ = iVar20 + iVar15 * -0xc + 2;
        local_e0.data_._0_4_ = (iVar2 * 100 + iVar16 + iVar15) - 0x1324;
        local_a0 = ((long)local_148 / 0x3c) % 0x3c;
        lVar8 = (long)local_148 / 0xe10;
        local_b0 = lVar8 + (((ulong)(lVar8 / 6 + (lVar8 >> 0x3f)) >> 2) - (lVar8 >> 0x3f)) * -0x18;
        if (local_128 == 0) {
          local_e0.data_._4_4_ = 0;
          local_d8.data_ =
               (long)absl::lts_20240722::str_format_internal::FormatArgImpl::Dispatch<int>;
          aStack_d0.status_.rep_._4_4_ = 0;
          local_c8 = absl::lts_20240722::str_format_internal::FormatArgImpl::Dispatch<int>;
          local_b8 = absl::lts_20240722::str_format_internal::FormatArgImpl::Dispatch<int>;
          local_b0 = local_b0 & 0xffffffff;
          local_a8 = absl::lts_20240722::str_format_internal::FormatArgImpl::Dispatch<int>;
          local_a0 = local_a0 & 0xffffffff;
          local_98 = absl::lts_20240722::str_format_internal::FormatArgImpl::Dispatch<int>;
          local_90 = (long)local_148 % 0x3c & 0xffffffff;
          local_88 = absl::lts_20240722::str_format_internal::FormatArgImpl::Dispatch<int>;
          absl::lts_20240722::str_format_internal::FormatPack_abi_cxx11_
                    (&local_180,"\"%04d-%02d-%02dT%02d:%02d:%02dZ\"",0x20,&local_e0,6);
          io::zc_sink_internal::ZeroCopyStreamByteSink::Append
                    (&writer->sink_,(char *)local_180,(size_t)aStack_178);
        }
        else {
          uVar18 = -local_128;
          if (0 < (int)local_128) {
            uVar18 = local_128;
          }
          local_80 = 9;
          uVar23 = uVar18 * 0x26e978d5 >> 3 | uVar18 * -0x60000000;
          while (uVar23 < 0x418938) {
            local_80 = local_80 + -3;
            uVar23 = (uVar18 / 1000) * 0x26e978d5 >> 3 | (uVar18 / 1000) * -0x60000000;
            uVar18 = uVar18 / 1000;
          }
          local_e0.data_._4_4_ = 0;
          local_d8.data_ =
               (long)absl::lts_20240722::str_format_internal::FormatArgImpl::Dispatch<int>;
          aStack_d0.status_.rep_._4_4_ = 0;
          local_c8 = absl::lts_20240722::str_format_internal::FormatArgImpl::Dispatch<int>;
          local_b8 = absl::lts_20240722::str_format_internal::FormatArgImpl::Dispatch<int>;
          local_b0 = local_b0 & 0xffffffff;
          local_a8 = absl::lts_20240722::str_format_internal::FormatArgImpl::Dispatch<int>;
          local_a0 = local_a0 & 0xffffffff;
          local_98 = absl::lts_20240722::str_format_internal::FormatArgImpl::Dispatch<int>;
          local_90 = (long)local_148 % 0x3c & 0xffffffff;
          local_88 = absl::lts_20240722::str_format_internal::FormatArgImpl::Dispatch<int>;
          local_78 = absl::lts_20240722::str_format_internal::FormatArgImpl::Dispatch<unsigned_long>
          ;
          local_70 = (ulong)uVar18;
          local_68 = absl::lts_20240722::str_format_internal::FormatArgImpl::Dispatch<unsigned_int>;
          absl::lts_20240722::str_format_internal::FormatPack_abi_cxx11_
                    (&local_180,"\"%04d-%02d-%02dT%02d:%02d:%02d.%.*dZ\"",0x25,&local_e0,8);
          io::zc_sink_internal::ZeroCopyStreamByteSink::Append
                    (&writer->sink_,(char *)local_180,(size_t)aStack_178);
        }
LAB_002d32e9:
        aVar24 = local_180;
        if ((anon_union_8_1_1246618d_for_StatusOrData<int>_1 *)local_180.data_ != &local_170) {
LAB_002d32fc:
          operator_delete((void *)aVar24,(long)local_170 + 1);
        }
LAB_002d3304:
        *(undefined8 *)this = 1;
        goto LAB_002d330b;
      }
      pcVar21 = "maximum acceptable time value is 9999-12-31T23:59:59Z";
    }
    absl::lts_20240722::InvalidArgumentError(this,0x35,pcVar21);
    goto LAB_002d3315;
  case kDuration:
    pFVar10 = Proto2Descriptor::MustHaveField(desc,1);
    sVar17 = UnparseProto2Descriptor::GetSize(pFVar10,msg);
    if (sVar17 == 0) {
      local_148 = (anon_union_8_1_1246618d_for_StatusOrData<int>_1)0x0;
    }
    else {
      MVar27 = Message::GetMetadata(msg);
      local_148 = (anon_union_8_1_1246618d_for_StatusOrData<int>_1)
                  Reflection::GetInt64(MVar27.reflection,msg,pFVar10);
    }
    local_150.data_ = 1;
    *(undefined8 *)this = 1;
    if ((long)local_148 - 0x4979cb9e01U < 0xffffff6d0c68c3ff) {
      absl::lts_20240722::InvalidArgumentError(this,0x15,"duration out of range");
    }
    else {
      pFVar10 = Proto2Descriptor::MustHaveField(desc,2);
      sVar17 = UnparseProto2Descriptor::GetSize(pFVar10,msg);
      if (sVar17 == 0) {
        local_128 = 0;
      }
      else {
        MVar27 = Message::GetMetadata(msg);
        local_128 = Reflection::GetInt32(MVar27.reflection,msg,pFVar10);
      }
      local_130 = (anon_union_8_1_1246618d_for_StatusOrData<int>_1)0x1;
      *(undefined8 *)this = 1;
      if (local_128 + 0xc4653600 < 0x88ca6c01) {
        pcVar21 = "duration out of range";
        uVar22 = 0x15;
      }
      else {
        if ((anon_union_8_1_1246618d_for_StatusOrData<int>_1)local_150.data_ !=
            (anon_union_8_1_1246618d_for_StatusOrData<int>_1)0x1) goto LAB_002d3797;
        if ((local_128 == 0 || local_148 == (anon_union_8_1_1246618d_for_StatusOrData<int>_1)0x0) ||
           (local_128 >> 0x1f == -(local_148._4_4_ >> 0x1f))) {
          if (local_128 != 0) {
            uVar18 = -local_128;
            if (0 < (int)local_128) {
              uVar18 = local_128;
            }
            local_c0 = 9;
            uVar23 = uVar18 * 0x26e978d5 >> 3 | uVar18 * -0x60000000;
            local_b0 = (ulong)uVar18;
            while (uVar23 < 0x418938) {
              local_c0 = local_c0 - 3;
              iVar15 = (int)(local_b0 / 1000);
              local_b0 = local_b0 / 1000;
              uVar23 = (uint)(iVar15 * 0x26e978d5) >> 3 | iVar15 * -0x60000000;
            }
            local_100 = "";
            if ((int)local_128 < 0 || (long)local_148 < 0) {
              local_100 = "-";
            }
            local_108.data_._1_7_ = 0;
            local_108.data_._0_1_ = (int)local_128 < 0 || (long)local_148 < 0;
            local_e0.data_ = (long)&local_108;
            aStack_d0 = (anon_union_8_1_1246618d_for_StatusOrData<int>_1)-(long)local_148;
            if (0 < (long)local_148) {
              aStack_d0 = local_148;
            }
            local_d8.data_ =
                 (long)absl::lts_20240722::str_format_internal::FormatArgImpl::
                       Dispatch<std::basic_string_view<char,std::char_traits<char>>>;
            local_c8 = absl::lts_20240722::str_format_internal::FormatArgImpl::Dispatch<long>;
            local_b8 = absl::lts_20240722::str_format_internal::FormatArgImpl::
                       Dispatch<unsigned_long>;
            local_a8 = absl::lts_20240722::str_format_internal::FormatArgImpl::
                       Dispatch<unsigned_int>;
            absl::lts_20240722::str_format_internal::FormatPack_abi_cxx11_
                      (&local_180,"\"%s%d.%.*ds\"",0xc,&local_e0,4);
            io::zc_sink_internal::ZeroCopyStreamByteSink::Append
                      (&writer->sink_,(char *)local_180,(size_t)aStack_178);
            goto LAB_002d32e9;
          }
          local_180.data_ = (long)local_148;
          aStack_178 = (anon_union_8_1_1246618d_for_StatusOrData<int>_1)
                       absl::lts_20240722::str_format_internal::FormatArgImpl::Dispatch<long>;
          absl::lts_20240722::str_format_internal::FormatPack_abi_cxx11_
                    (&local_e0,"\"%ds\"",5,&local_180,1);
          io::zc_sink_internal::ZeroCopyStreamByteSink::Append
                    (&writer->sink_,(char *)local_e0,local_d8.data_);
          local_170 = aStack_d0;
          aVar24 = local_e0;
          if ((anon_union_8_1_1246618d_for_StatusOrData<int>_1 *)local_e0.data_ != &aStack_d0)
          goto LAB_002d32fc;
          goto LAB_002d3304;
        }
        pcVar21 = "nanos and seconds signs do not match";
        uVar22 = 0x24;
      }
      absl::lts_20240722::InvalidArgumentError(this,uVar22,pcVar21);
LAB_002d330b:
      absl::lts_20240722::internal_statusor::StatusOrData<int>::~StatusOrData
                ((StatusOrData<int> *)&local_130.status_);
    }
LAB_002d3315:
    absl::lts_20240722::internal_statusor::StatusOrData<long>::~StatusOrData
              ((StatusOrData<long> *)&local_150);
    break;
  case kFieldMask:
    local_f0 = Proto2Descriptor::MustHaveField(desc,1);
    puVar11 = (undefined1 *)UnparseProto2Descriptor::GetSize(local_f0,msg);
    local_e0.data_._0_1_ = 0x22;
    io::zc_sink_internal::ZeroCopyStreamByteSink::Append(&writer->sink_,(char *)&local_e0.data_,1);
    local_48 = puVar11;
    if (puVar11 != (undefined1 *)0x0) {
      local_50 = &writer->scratch_buf_;
      local_110 = CONCAT44(local_110._4_4_,(int)CONCAT71((int7)((ulong)local_50 >> 8),1));
      pFVar10 = (Field)0x0;
      local_58 = this;
      do {
        paVar3 = local_58;
        if ((local_110 & 1) == 0) {
          io::zc_sink_internal::ZeroCopyStreamByteSink::Append(&writer->sink_,",",1);
        }
        else {
          local_110 = local_110 & 0xffffffff00000000;
        }
        MVar27 = Message::GetMetadata(msg);
        local_e8 = pFVar10;
        psVar12 = Reflection::GetRepeatedStringReference
                            (MVar27.reflection,msg,local_f0,(int)pFVar10,local_50);
        aVar19 = (anon_union_8_1_1246618d_for_StatusOrData<int>_1)(psVar12->_M_dataplus)._M_p;
        aVar24 = (anon_union_8_2_a3c22f61_for_StatusOrData<long>_3)psVar12->_M_string_length;
        local_e0.data_ = 1;
        *(undefined8 *)paVar3 = 1;
        local_d8 = aVar24;
        aStack_d0 = aVar19;
        if ((anon_union_8_1_1246618d_for_StatusOrData<int>_1)aVar24.data_ !=
            (anon_union_8_1_1246618d_for_StatusOrData<int>_1)0x0) {
          aVar26 = (anon_union_8_1_1246618d_for_StatusOrData<int>_1)0x0;
          bVar5 = false;
          do {
            bVar1 = *(byte *)((long)aVar19 + (long)aVar26);
            if (((byte)(bVar1 + 0x9f) < 0x1a) && (bVar5)) {
              local_180.data_._0_1_ =
                   *(undefined1 *)
                    ((long)&absl::lts_20240722::ascii_internal::kToUpper + (ulong)bVar1);
              io::zc_sink_internal::ZeroCopyStreamByteSink::Append
                        (&writer->sink_,(char *)&local_180.data_,1);
LAB_002d29c6:
              uVar18 = 0;
              bVar4 = false;
            }
            else {
              if (((byte)(bVar1 + 0x9f) < 0x1a) || ((bVar1 == 0x2e || ((byte)(bVar1 - 0x30) < 10))))
              {
                local_180.data_._0_1_ = bVar1;
                io::zc_sink_internal::ZeroCopyStreamByteSink::Append
                          (&writer->sink_,(char *)&local_180.data_,1);
                goto LAB_002d29c6;
              }
              if (bVar1 == 0x5f) {
                uVar18 = 8;
                bVar4 = true;
                if ((bVar5) && ((writer->options_).allow_legacy_syntax == false)) goto LAB_002d2970;
              }
              else {
LAB_002d2970:
                if ((writer->options_).allow_legacy_syntax != false) {
                  if (bVar5) {
                    local_180.data_._0_1_ = 0x5f;
                    io::zc_sink_internal::ZeroCopyStreamByteSink::Append
                              (&writer->sink_,(char *)&local_180.data_,1);
                  }
                  local_180.data_._0_1_ = bVar1;
                  io::zc_sink_internal::ZeroCopyStreamByteSink::Append
                            (&writer->sink_,(char *)&local_180.data_,1);
                  goto LAB_002d29c6;
                }
                uVar18 = 1;
                absl::lts_20240722::InvalidArgumentError
                          (local_58,0x21,"unexpected character in FieldMask");
                bVar4 = bVar5;
              }
            }
            bVar5 = bVar4;
            if ((uVar18 & 7) != 0) goto LAB_002d2a0a;
            aVar26 = (anon_union_8_1_1246618d_for_StatusOrData<int>_1)((long)aVar26 + 1);
          } while ((anon_union_8_1_1246618d_for_StatusOrData<int>_1)aVar24.data_ != aVar26);
        }
        uVar18 = 7;
LAB_002d2a0a:
        absl::lts_20240722::internal_statusor::
        StatusOrData<std::basic_string_view<char,_std::char_traits<char>_>_>::~StatusOrData
                  ((StatusOrData<std::basic_string_view<char,_std::char_traits<char>_>_> *)&local_e0
                  );
        if ((uVar18 != 7) && (uVar18 != 0)) {
          return (Status)(uintptr_t)local_58;
        }
        pFVar10 = (Field)&local_e8->field_0x1;
        this = local_58;
        msg = local_60;
      } while (pFVar10 != (Field)local_48);
    }
    pcVar21 = (char *)&local_e0;
    local_e0.data_._0_1_ = 0x22;
    sVar17 = 1;
LAB_002d2bdd:
    io::zc_sink_internal::ZeroCopyStreamByteSink::Append(&writer->sink_,pcVar21,sVar17);
LAB_002d2be2:
    *(undefined8 *)this = 1;
  }
  return (Status)(uintptr_t)this;
}

Assistant:

absl::Status WriteMessage(JsonWriter& writer, const Msg<Traits>& msg,
                          const Desc<Traits>& desc, bool is_top_level) {
  switch (ClassifyMessage(Traits::TypeName(desc))) {
    case MessageType::kAny:
      return WriteAny<Traits>(writer, msg, desc);
    case MessageType::kWrapper: {
      auto field = Traits::MustHaveField(desc, 1);
      if (Traits::GetSize(field, msg) == 0) {
        return WriteSingular<Traits>(writer, field);
      }
      return WriteSingular<Traits>(writer, field, msg);
    }
    case MessageType::kValue:
      return WriteValue<Traits>(writer, msg, desc, is_top_level);
    case MessageType::kStruct:
      return WriteStructValue<Traits>(writer, msg, desc);
    case MessageType::kList:
      return WriteListValue<Traits>(writer, msg, desc);
    case MessageType::kTimestamp:
      return WriteTimestamp<Traits>(writer, msg, desc);
    case MessageType::kDuration:
      return WriteDuration<Traits>(writer, msg, desc);
    case MessageType::kFieldMask:
      return WriteFieldMask<Traits>(writer, msg, desc);
    default: {
      writer.Write("{");
      writer.Push();
      bool first = true;
      RETURN_IF_ERROR(WriteFields<Traits>(writer, msg, desc, first));
      writer.Pop();
      if (!first) {
        writer.NewLine();
      }
      writer.Write("}");
      return absl::OkStatus();
    }
  }
}